

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O3

void __thiscall
chrono::ChFile_ps::DrawText
          (ChFile_ps *this,ChVector2<double> *mfrom,double number,Space space,
          Justification justified)

{
  char mbuff [20];
  ChVector2<double> local_58;
  char local_48 [32];
  
  sprintf(local_48,(this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii.number_format,number);
  local_58.m_data[0] = mfrom->m_data[0];
  local_58.m_data[1] = mfrom->m_data[1];
  DrawText(this,&local_58,local_48,space,justified);
  return;
}

Assistant:

void ChFile_ps::DrawText(ChVector2<> mfrom, double number, Space space, Justification justified) {
    char mbuff[20];
    sprintf(mbuff, this->number_format, number);
    DrawText(mfrom, mbuff, space, justified);
}